

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * __thiscall
testing::internal::FlagToEnvVar_abi_cxx11_(string *__return_storage_ptr__,internal *this,char *flag)

{
  size_type sVar1;
  Message *pMVar2;
  size_type sVar3;
  char *pcVar4;
  char local_61;
  size_type local_60;
  size_t i;
  Message env_var;
  Message local_40;
  undefined1 local_38 [8];
  string full_flag;
  char *flag_local;
  
  full_flag.field_2._8_8_ = this;
  Message::Message(&local_40);
  pMVar2 = Message::operator<<(&local_40,(char (*) [7])"gtest_");
  pMVar2 = Message::operator<<(pMVar2,(char **)((long)&full_flag.field_2 + 8));
  Message::GetString_abi_cxx11_((string *)local_38,pMVar2);
  Message::~Message(&local_40);
  Message::Message((Message *)&i);
  local_60 = 0;
  while( true ) {
    sVar1 = local_60;
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
                      );
    if (sVar1 == sVar3) break;
    pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38);
    local_61 = ToUpper(pcVar4[local_60]);
    Message::operator<<((Message *)&i,&local_61);
    local_60 = local_60 + 1;
  }
  Message::GetString_abi_cxx11_(__return_storage_ptr__,(Message *)&i);
  Message::~Message((Message *)&i);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string FlagToEnvVar(const char* flag) {
  const std::string full_flag =
      (Message() << GTEST_FLAG_PREFIX_ << flag).GetString();

  Message env_var;
  for (size_t i = 0; i != full_flag.length(); i++) {
    env_var << ToUpper(full_flag.c_str()[i]);
  }

  return env_var.GetString();
}